

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyCut.c
# Opt level: O0

int Ivy_NodeCutDeriveNew(Ivy_Cut_t *pCut,Ivy_Cut_t *pCutNew,int IdOld,int IdNew0,int IdNew1)

{
  uint uVar1;
  int local_30;
  int local_2c;
  int k;
  int i;
  uint uHash;
  int IdNew1_local;
  int IdNew0_local;
  int IdOld_local;
  Ivy_Cut_t *pCutNew_local;
  Ivy_Cut_t *pCut_local;
  
  k = 0;
  if (pCut->nSize < 1) {
    __assert_fail("pCut->nSize > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyCut.c"
                  ,0x270,"int Ivy_NodeCutDeriveNew(Ivy_Cut_t *, Ivy_Cut_t *, int, int, int)");
  }
  if (IdNew1 <= IdNew0) {
    __assert_fail("IdNew0 < IdNew1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyCut.c"
                  ,0x271,"int Ivy_NodeCutDeriveNew(Ivy_Cut_t *, Ivy_Cut_t *, int, int, int)");
  }
  local_30 = 0;
  i = IdNew1;
  uHash = IdNew0;
  for (local_2c = 0; local_2c < pCut->nSize; local_2c = local_2c + 1) {
    if (pCut->pArray[local_2c] != IdOld) {
      if ((int)uHash <= pCut->pArray[local_2c]) {
        if ((int)uHash < pCut->pArray[local_2c]) {
          pCutNew->pArray[local_30] = uHash;
          uVar1 = Ivy_NodeCutHashValue(uHash);
          k = uVar1 | k;
          local_30 = local_30 + 1;
        }
        uHash = 0x7fffffff;
      }
      if (i <= pCut->pArray[local_2c]) {
        if (i < pCut->pArray[local_2c]) {
          pCutNew->pArray[local_30] = i;
          uVar1 = Ivy_NodeCutHashValue(i);
          k = uVar1 | k;
          local_30 = local_30 + 1;
        }
        i = 0x7fffffff;
      }
      pCutNew->pArray[local_30] = pCut->pArray[local_2c];
      uVar1 = Ivy_NodeCutHashValue(pCut->pArray[local_2c]);
      k = uVar1 | k;
      local_30 = local_30 + 1;
    }
  }
  if ((int)uHash < 0x7fffffff) {
    pCutNew->pArray[local_30] = uHash;
    uVar1 = Ivy_NodeCutHashValue(uHash);
    k = uVar1 | k;
    local_30 = local_30 + 1;
  }
  if (i < 0x7fffffff) {
    pCutNew->pArray[local_30] = i;
    uVar1 = Ivy_NodeCutHashValue(i);
    k = uVar1 | k;
    local_30 = local_30 + 1;
  }
  pCutNew->nSize = (short)local_30;
  pCutNew->uHash = k;
  if (pCut->nSizeMax < pCutNew->nSize) {
    __assert_fail("pCutNew->nSize <= pCut->nSizeMax",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyCut.c"
                  ,0x297,"int Ivy_NodeCutDeriveNew(Ivy_Cut_t *, Ivy_Cut_t *, int, int, int)");
  }
  return 1;
}

Assistant:

static inline int Ivy_NodeCutDeriveNew( Ivy_Cut_t * pCut, Ivy_Cut_t * pCutNew, int IdOld, int IdNew0, int IdNew1 )
{
    unsigned uHash = 0;
    int i, k; 
    assert( pCut->nSize > 0 );
    assert( IdNew0 < IdNew1 );
    for ( i = k = 0; i < pCut->nSize; i++ )
    {
        if ( pCut->pArray[i] == IdOld )
            continue;
        if ( IdNew0 <= pCut->pArray[i] )
        {
            if ( IdNew0 < pCut->pArray[i] )
            {
                pCutNew->pArray[ k++ ] = IdNew0;
                uHash |= Ivy_NodeCutHashValue( IdNew0 );
            }
            IdNew0 = 0x7FFFFFFF;
        }
        if ( IdNew1 <= pCut->pArray[i] )
        {
            if ( IdNew1 < pCut->pArray[i] )
            {
                pCutNew->pArray[ k++ ] = IdNew1;
                uHash |= Ivy_NodeCutHashValue( IdNew1 );
            }
            IdNew1 = 0x7FFFFFFF;
        }
        pCutNew->pArray[ k++ ] = pCut->pArray[i];
        uHash |= Ivy_NodeCutHashValue( pCut->pArray[i] );
    }
    if ( IdNew0 < 0x7FFFFFFF )
    {
        pCutNew->pArray[ k++ ] = IdNew0;
        uHash |= Ivy_NodeCutHashValue( IdNew0 );
    }
    if ( IdNew1 < 0x7FFFFFFF )
    {
        pCutNew->pArray[ k++ ] = IdNew1;
        uHash |= Ivy_NodeCutHashValue( IdNew1 );
    }
    pCutNew->nSize = k;
    pCutNew->uHash = uHash;
    assert( pCutNew->nSize <= pCut->nSizeMax );
//    for ( i = 1; i < pCutNew->nSize; i++ )
//        assert( pCutNew->pArray[i-1] < pCutNew->pArray[i] );
    return 1;
}